

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

connectbundle * Curl_conncache_find_bundle(connectdata *conn,conncache *connc)

{
  size_t key_len;
  connectbundle *pcVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  char key [128];
  char acStack_98 [128];
  
  if (conn->data->share != (Curl_share *)0x0) {
    Curl_share_lock(conn->data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    in_RDX = extraout_RDX;
  }
  if (connc == (conncache *)0x0) {
    pcVar1 = (connectbundle *)0x0;
  }
  else {
    hashkey(conn,acStack_98,in_RDX);
    key_len = strlen(acStack_98);
    pcVar1 = (connectbundle *)Curl_hash_pick(&connc->hash,acStack_98,key_len);
  }
  return pcVar1;
}

Assistant:

struct connectbundle *Curl_conncache_find_bundle(struct connectdata *conn,
                                                 struct conncache *connc)
{
  struct connectbundle *bundle = NULL;
  CONN_LOCK(conn->data);
  if(connc) {
    char key[128];
    hashkey(conn, key, sizeof(key));
    bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
  }

  return bundle;
}